

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall CMU462::ImageBuffer::update_pixel(ImageBuffer *this,Color *c,size_t x,size_t y)

{
  reference pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint32_t p;
  size_t y_local;
  size_t x_local;
  Color *c_local;
  ImageBuffer *this_local;
  
  fVar2 = clamp<float>(0.0,1.0,c->a);
  fVar3 = clamp<float>(0.0,1.0,c->b);
  fVar4 = clamp<float>(0.0,1.0,c->g);
  fVar5 = clamp<float>(0.0,1.0,c->r);
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->data,x + y * this->w);
  *pvVar1 = (int)(long)(fVar5 * 255.0) +
            (int)(long)(fVar2 * 255.0) * 0x1000000 + (int)(long)(fVar3 * 255.0) * 0x10000 +
            (int)(long)(fVar4 * 255.0) * 0x100;
  return;
}

Assistant:

void update_pixel(const Color& c, size_t x, size_t y) {
      // assert(0 <= x && x < w);
      // assert(0 <= y && y < h);
      uint32_t p = 0;
      p += ((uint32_t) (clamp(0.f, 1.f, c.a) * 255)) << 24;
      p += ((uint32_t) (clamp(0.f, 1.f, c.b) * 255)) << 16;
      p += ((uint32_t) (clamp(0.f, 1.f, c.g) * 255)) << 8;
      p += ((uint32_t) (clamp(0.f, 1.f, c.r) * 255));
      data[x + y * w] = p;
    }